

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O2

Reals __thiscall Omega_h::resize_vectors(Omega_h *this,Reals *old_vectors,Int old_dim,Int new_dim)

{
  Alloc *pAVar1;
  int iVar2;
  int iVar3;
  void *extraout_RDX;
  ulong uVar4;
  void *extraout_RDX_00;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  Reals RVar9;
  Write<double> new_vectors;
  type f;
  Write<double> local_100;
  Alloc *local_f0;
  Write<signed_char> local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Write<signed_char> local_b8;
  int local_a8;
  uint local_a0 [2];
  Write<double> local_98;
  Int local_88;
  Write<double> local_80;
  Int local_70;
  uint local_68 [2];
  Write<double> local_60;
  Int local_50;
  Write<double> local_48;
  Int local_38;
  
  if (old_dim == new_dim) {
    Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)old_vectors);
    pvVar5 = extraout_RDX;
  }
  else {
    pAVar1 = (old_vectors->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar6 = pAVar1->size;
    }
    else {
      sVar6 = (ulong)pAVar1 >> 3;
    }
    iVar2 = divide_no_remainder<int>((int)(sVar6 >> 3),old_dim);
    std::__cxx11::string::string((string *)local_d8,"",(allocator *)local_a0);
    Write<double>::Write(&local_100,iVar2 * new_dim,(string *)local_d8);
    local_f0 = (Alloc *)this;
    std::__cxx11::string::~string((string *)local_d8);
    local_68[0] = old_dim;
    if (new_dim < old_dim) {
      local_68[0] = new_dim;
    }
    Write<double>::Write(&local_60,&local_100);
    local_50 = new_dim;
    Write<double>::Write(&local_48,&old_vectors->write_);
    local_a0[0] = local_68[0];
    local_38 = old_dim;
    Write<double>::Write(&local_98,&local_60);
    local_88 = local_50;
    Write<double>::Write(&local_80,&local_48);
    local_70 = local_38;
    if (0 < iVar2) {
      entering_parallel = 1;
      local_d8._0_4_ = local_a0[0];
      Write<double>::Write((Write<signed_char> *)(local_d8 + 8),(Write<signed_char> *)&local_98);
      local_c8._8_4_ = local_88;
      Write<double>::Write(&local_b8,(Write<signed_char> *)&local_80);
      local_a8 = local_70;
      entering_parallel = 0;
      uVar4 = 0;
      iVar3 = 0;
      if (0 < (int)local_d8._0_4_) {
        uVar4 = (ulong)(uint)local_d8._0_4_;
        iVar3 = 0;
      }
      for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          *(undefined8 *)
           ((long)(local_c8._8_4_ * iVar3) * 8 + local_c8._M_allocated_capacity + uVar8 * 8) =
               *(undefined8 *)
                ((long)local_b8.shared_alloc_.direct_ptr + uVar8 * 8 + (long)(local_70 * iVar3) * 8)
          ;
        }
        for (lVar7 = (long)(int)local_d8._0_4_; lVar7 < (int)local_c8._8_4_; lVar7 = lVar7 + 1) {
          *(undefined8 *)
           ((long)(local_c8._8_4_ * iVar3) * 8 + local_c8._M_allocated_capacity + lVar7 * 8) = 0;
        }
      }
      resize_vectors(Omega_h::Read<double>,int,int)::$_0::~__0((__0 *)local_d8);
    }
    resize_vectors(Omega_h::Read<double>,int,int)::$_0::~__0((__0 *)local_a0);
    Write<double>::Write(&local_e8,(Write<signed_char> *)&local_100);
    this = (Omega_h *)local_f0;
    Read<double>::Read((Read<signed_char> *)local_f0,(Write<double> *)&local_e8);
    Write<double>::~Write((Write<double> *)&local_e8);
    resize_vectors(Omega_h::Read<double>,int,int)::$_0::~__0((__0 *)local_68);
    Write<double>::~Write(&local_100);
    pvVar5 = extraout_RDX_00;
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar9.write_.shared_alloc_;
}

Assistant:

Reals resize_vectors(Reals old_vectors, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_vectors;
  auto nv = divide_no_remainder(old_vectors.size(), old_dim);
  Write<Real> new_vectors(nv * new_dim);
  auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    for (Int j = 0; j < min_dim; ++j) {
      new_vectors[i * new_dim + j] = old_vectors[i * old_dim + j];
    }
    for (Int j = min_dim; j < new_dim; ++j) {
      new_vectors[i * new_dim + j] = 0.0;
    }
  };
  parallel_for(nv, f, "resize_vectors");
  return new_vectors;
}